

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-merge.cpp
# Opt level: O1

void __thiscall
(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::
unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::
allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::
equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::
unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::
allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper::visitExpression(wasm::
Expression__(void *this,Expression *curr)

{
  uintptr_t uVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  RefFunc *cast;
  ModuleItemKind kind;
  ulong uVar5;
  
  switch(curr->_id) {
  case InvalidId:
  case NumExpressionIds:
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
               ,0x103);
  default:
    return;
  case CallId:
    if (curr[3].type.id == 0) {
      return;
    }
    kind = Function;
    goto LAB_00111d6d;
  case CallIndirectId:
    if (curr[4].type.id == 0) {
      return;
    }
    kind = Table;
    goto LAB_00111de0;
  case GlobalGetId:
  case GlobalSetId:
    if (curr[1].type.id == 0) {
      return;
    }
    kind = Global;
    break;
  case StoreId:
    if (*(long *)(curr + 5) == 0) {
      return;
    }
    kind = Memory;
    lVar3 = 0x48;
    goto LAB_00111e5a;
  case MemorySizeId:
    if (curr[1].type.id == 0) {
      return;
    }
    kind = Memory;
    break;
  case MemoryGrowId:
    if (*(long *)(curr + 2) == 0) {
      return;
    }
    kind = Memory;
    lVar3 = 0x18;
    goto LAB_00111e5a;
  case AtomicRMWId:
  case SIMDLoadId:
    if (curr[3].type.id == 0) {
      return;
    }
    kind = Memory;
LAB_00111d6d:
    lVar3 = 0x30;
    goto LAB_00111e5a;
  case SIMDLoadStoreLaneId:
    if (curr[4].type.id == 0) {
      return;
    }
    kind = Memory;
LAB_00111de0:
    lVar3 = 0x40;
    goto LAB_00111e5a;
  case MemoryInitId:
    if (curr[1].type.id != 0) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,DataSegment,(Name *)(curr + 1));
    }
  case LoadId:
  case AtomicCmpxchgId:
  case AtomicWaitId:
    if (*(long *)(curr + 4) == 0) {
      return;
    }
    kind = Memory;
    goto LAB_00111e0f;
  case DataDropId:
  case ArrayNewDataId:
  case ArrayInitDataId:
    if (curr[1].type.id == 0) {
      return;
    }
    kind = DataSegment;
    break;
  case MemoryCopyId:
    if (*(long *)(curr + 4) != 0) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Memory,(Name *)&curr[3].type);
    }
  case AtomicNotifyId:
  case MemoryFillId:
    if (*(long *)(curr + 3) == 0) {
      return;
    }
    kind = Memory;
    goto LAB_00111e55;
  case RefFuncId:
    if (curr[1].type.id == 0) {
      return;
    }
    kind = Function;
    break;
  case TableGetId:
  case TableSetId:
  case TableSizeId:
  case TableGrowId:
  case TableFillId:
    if (curr[1].type.id == 0) {
      return;
    }
    kind = Table;
    break;
  case TableCopyId:
    if (*(long *)(curr + 4) != 0) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Table,(Name *)&curr[3].type);
    }
    if (*(long *)(curr + 3) == 0) {
      return;
    }
    kind = Table;
LAB_00111e55:
    lVar3 = 0x28;
    goto LAB_00111e5a;
  case TableInitId:
    if (curr[1].type.id != 0) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,ElementSegment,(Name *)(curr + 1));
    }
    if (*(long *)(curr + 4) == 0) {
      return;
    }
    kind = Table;
LAB_00111e0f:
    lVar3 = 0x38;
    goto LAB_00111e5a;
  case TryId:
    if (*(long *)(curr + 3) != 0) {
      uVar4 = 0;
      uVar5 = 1;
      do {
        uVar1 = curr[2].type.id;
        if (*(long *)(uVar1 + 8 + uVar4 * 0x10) != 0) {
          mapName(wasm::ModuleItemKind,wasm::Name__(this,Tag,(Name *)(uVar1 + uVar4 * 0x10));
        }
        bVar2 = uVar5 < *(ulong *)(curr + 3);
        uVar4 = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar2);
      return;
    }
    return;
  case TryTableId:
    if (*(long *)(curr + 2) != 0) {
      uVar4 = 0;
      uVar5 = 1;
      do {
        uVar1 = curr[1].type.id;
        if (*(long *)(uVar1 + 8 + uVar4 * 0x10) != 0) {
          mapName(wasm::ModuleItemKind,wasm::Name__(this,Tag,(Name *)(uVar1 + uVar4 * 0x10));
        }
        bVar2 = uVar5 < *(ulong *)(curr + 2);
        uVar4 = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar2);
      return;
    }
    return;
  case ArrayNewElemId:
  case ArrayInitElemId:
    if (curr[1].type.id == 0) {
      return;
    }
    kind = ElementSegment;
    break;
  case ResumeId:
    if (curr[1].type.id == 0) {
      return;
    }
    uVar4 = 0;
    uVar5 = 1;
    do {
      if (*(long *)(*(long *)(curr + 1) + 8 + uVar4 * 0x10) != 0) {
        mapName(wasm::ModuleItemKind,wasm::Name__
                  (this,Tag,(Name *)(*(long *)(curr + 1) + uVar4 * 0x10));
      }
      bVar2 = uVar5 < curr[1].type.id;
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
    return;
  case ResumeThrowId:
    if (curr[2].type.id != 0) {
      uVar4 = 0;
      uVar5 = 1;
      do {
        if (*(long *)(*(long *)(curr + 2) + 8 + uVar4 * 0x10) != 0) {
          mapName(wasm::ModuleItemKind,wasm::Name__
                    (this,Tag,(Name *)(*(long *)(curr + 2) + uVar4 * 0x10));
        }
        bVar2 = uVar5 < curr[2].type.id;
        uVar4 = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar2);
    }
  case ThrowId:
  case SuspendId:
  case StackSwitchId:
    if (curr[1].type.id == 0) {
      return;
    }
    kind = Tag;
  }
  lVar3 = 0x10;
LAB_00111e5a:
  mapName(wasm::ModuleItemKind,wasm::Name__(this,kind,(Name *)(&curr->_id + lVar3));
  return;
}

Assistant:

void visitExpression(Expression* curr) {
#define DELEGATE_ID curr->_id

#define DELEGATE_START(id) [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_CHILD(id, field)
#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)
#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#define DELEGATE_FIELD_NAME_KIND(id, field, kind)                              \
  if (cast->field.is()) {                                                      \
    mapName(kind, cast->field);                                                \
  }

#include "wasm-delegations-fields.def"
    }